

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.h
# Opt level: O0

uint __thiscall
o3dgc::Arithmetic_Codec::ExpGolombDecode
          (Arithmetic_Codec *this,int k,Static_Bit_Model *bModel0,Adaptive_Bit_Model *bModel1)

{
  uint uVar1;
  int iVar2;
  undefined4 local_34;
  undefined4 local_30;
  int binary_symbol;
  int symbol;
  uint l;
  Adaptive_Bit_Model *bModel1_local;
  Static_Bit_Model *bModel0_local;
  int k_local;
  Arithmetic_Codec *this_local;
  
  local_30 = 0;
  local_34 = 0;
  bModel0_local._4_4_ = k;
  do {
    uVar1 = decode(this,bModel1);
    if (uVar1 == 1) {
      local_30 = (1 << ((byte)bModel0_local._4_4_ & 0x1f)) + local_30;
      bModel0_local._4_4_ = bModel0_local._4_4_ + 1;
    }
  } while (uVar1 != 0);
  while (iVar2 = bModel0_local._4_4_ + -1, bModel0_local._4_4_ != 0) {
    uVar1 = decode(this,bModel0);
    bModel0_local._4_4_ = iVar2;
    if (uVar1 == 1) {
      local_34 = 1 << ((byte)iVar2 & 0x1f) | local_34;
    }
  }
  return local_30 + local_34;
}

Assistant:

unsigned   ExpGolombDecode(int k,
                               Static_Bit_Model & bModel0,
                               Adaptive_Bit_Model & bModel1)
               {
                   unsigned int l;
                   int symbol = 0;
                   int binary_symbol = 0;
                   do
                   {
                       l=decode(bModel1);
                       if (l==1)
                       {
                           symbol += (1<<k);
                           k++;
                        }
                   }
                   while (l!=0);
                   while (k--)                             //next binary part
                   if (decode(bModel0)==1)
                   {
                       binary_symbol |= (1<<k);
                   }
                   return (unsigned int) (symbol+binary_symbol);
                }